

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void __thiscall
QCss::ValueExtractor::borderValue
          (ValueExtractor *this,Declaration *decl,int *width,BorderStyle *style,QBrush *color)

{
  QColor color_00;
  bool bVar1;
  Type TVar2;
  const_reference pVVar3;
  DeclarationData *pDVar4;
  qsizetype qVar5;
  BorderStyle *in_RCX;
  Value *in_RDX;
  ValueExtractor *in_RSI;
  LengthData *in_RDI;
  long in_FS_OFFSET;
  LengthData LVar6;
  int i;
  QPalette *in_stack_00000070;
  BorderData data;
  BorderData data_1;
  Value *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  BrushStyle in_stack_fffffffffffffeb4;
  BorderData *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int iVar7;
  undefined4 uStack_e4;
  qreal local_e0;
  undefined8 local_d8;
  BorderStyle local_d0;
  int local_bc;
  undefined1 local_b0 [16];
  BorderStyle local_a0;
  int local_8c;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ffc9);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  if (bVar1) {
    memcpy(local_b0,&DAT_00bed648,0x28);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30001);
    qvariant_cast<QCss::BorderData>
              ((QVariant *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    TVar2 = lengthValueFromData(in_RDI,(QFont *)in_stack_fffffffffffffeb8);
    in_RDX->type = TVar2;
    *in_RCX = local_a0;
    if (local_8c == 0) {
      QColor::QColor((QColor *)0xa3007d);
      QBrush::QBrush((QBrush *)in_RDI,(QColor *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4)
      ;
    }
    else {
      brushFromData((BrushData *)in_stack_fffffffffffffeb8,
                    (QPalette *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    }
    QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (QBrush *)in_stack_fffffffffffffea8);
    QBrush::~QBrush((QBrush *)0xa300b6);
    BorderData::~BorderData((BorderData *)0xa300c3);
    goto LAB_00a30451;
  }
  in_RDX->type = Unknown;
  *in_RCX = BorderStyle_None;
  QColor::QColor((QColor *)0xa300eb);
  color_00.ct._0_4_ = in_stack_fffffffffffffeb4;
  color_00.cspec = in_stack_fffffffffffffeb0;
  color_00._8_8_ = in_stack_fffffffffffffeb8;
  QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,color_00);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3010f);
  bVar1 = QList<QCss::Value>::isEmpty((QList<QCss::Value> *)0xa3011b);
  if (bVar1) goto LAB_00a30451;
  memcpy(&local_e0,&DAT_00bed670,0x28);
  BorderData::BorderData((BorderData *)0xa30146);
  local_e0 = 0.0;
  local_d8 = (ulong)local_d8._4_4_ << 0x20;
  local_d0 = BorderStyle_None;
  iVar7 = 0;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30177);
  pVVar3 = QList<QCss::Value>::at
                     ((QList<QCss::Value> *)
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (qsizetype)in_stack_fffffffffffffea8);
  if (pVVar3->type == Length) {
LAB_00a301b1:
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa301bb);
    QList<QCss::Value>::at
              ((QList<QCss::Value> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (qsizetype)in_stack_fffffffffffffea8);
    LVar6 = lengthValue(in_RSI,in_RDX);
    local_e0 = LVar6.number;
    local_d8 = CONCAT44(uStack_e4,LVar6.unit);
    TVar2 = lengthValueFromData(in_RDI,(QFont *)in_stack_fffffffffffffeb8);
    in_RDX->type = TVar2;
    iVar7 = iVar7 + 1;
    in_stack_fffffffffffffeb8 = (BorderData *)(long)iVar7;
    pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30232
                       );
    qVar5 = QList<QCss::Value>::size(&pDVar4->values);
    if ((long)in_stack_fffffffffffffeb8 < qVar5) goto LAB_00a30297;
    ::QVariant::fromValue<QCss::BorderData>(in_stack_fffffffffffffeb8);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30267);
    ::QVariant::operator=
              ((QVariant *)in_stack_fffffffffffffeb8,
               (QVariant *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    ::QVariant::~QVariant(&local_28);
  }
  else {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30197);
    pVVar3 = QList<QCss::Value>::at
                       ((QList<QCss::Value> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (qsizetype)in_stack_fffffffffffffea8);
    if (pVVar3->type == Number) goto LAB_00a301b1;
LAB_00a30297:
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa302a1);
    QList<QCss::Value>::at
              ((QList<QCss::Value> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (qsizetype)in_stack_fffffffffffffea8);
    local_d0 = parseStyleValue(in_stack_fffffffffffffea8);
    if (local_d0 == BorderStyle_Unknown) {
      local_d0 = BorderStyle_None;
    }
    else {
      *in_RCX = local_d0;
      in_stack_fffffffffffffeb0 = iVar7 + 1;
      in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeb0 >> 0x1f;
      pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa302f9);
      qVar5 = QList<QCss::Value>::size(&pDVar4->values);
      if (qVar5 <= CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)) {
        ::QVariant::fromValue<QCss::BorderData>(in_stack_fffffffffffffeb8);
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3032e);
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffeb8,
                   (QVariant *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        ::QVariant::~QVariant(&local_48);
        goto LAB_00a30447;
      }
    }
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30373);
    QList<QCss::Value>::at
              ((QList<QCss::Value> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (qsizetype)in_stack_fffffffffffffea8);
    parseBrushValue((Value *)data.width.number,in_stack_00000070);
    BrushData::operator=
              ((BrushData *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (BrushData *)in_stack_fffffffffffffea8);
    BrushData::~BrushData((BrushData *)0xa303b7);
    if (local_bc != 0) {
      brushFromData((BrushData *)in_stack_fffffffffffffeb8,
                    (QPalette *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (QBrush *)in_stack_fffffffffffffea8);
      QBrush::~QBrush((QBrush *)0xa303f6);
      if (local_bc != 3) {
        ::QVariant::fromValue<QCss::BorderData>(in_stack_fffffffffffffeb8);
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3041c);
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffeb8,
                   (QVariant *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        ::QVariant::~QVariant(&local_68);
      }
    }
  }
LAB_00a30447:
  BorderData::~BorderData((BorderData *)0xa30451);
LAB_00a30451:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValueExtractor::borderValue(const Declaration &decl, int *width, QCss::BorderStyle *style, QBrush *color)
{
    if (decl.d->parsed.isValid()) {
        BorderData data = qvariant_cast<BorderData>(decl.d->parsed);
        *width = lengthValueFromData(data.width, f);
        *style = data.style;
        *color = data.color.type != BrushData::Invalid ? brushFromData(data.color, pal) : QBrush(QColor());
        return;
    }

    *width = 0;
    *style = BorderStyle_None;
    *color = QColor();

    if (decl.d->values.isEmpty())
        return;

    BorderData data;
    data.width.number = 0;
    data.width.unit = LengthData::None;
    data.style = BorderStyle_None;

    int i = 0;
    if (decl.d->values.at(i).type == Value::Length || decl.d->values.at(i).type == Value::Number) {
        data.width = lengthValue(decl.d->values.at(i));
        *width = lengthValueFromData(data.width, f);
        if (++i >= decl.d->values.size()) {
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
            return;
        }
    }

    data.style = parseStyleValue(decl.d->values.at(i));
    if (data.style != BorderStyle_Unknown) {
        *style = data.style;
        if (++i >= decl.d->values.size()) {
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
            return;
        }
    } else {
        data.style = BorderStyle_None;
    }

     data.color = parseBrushValue(decl.d->values.at(i), pal);
    if (data.color.type != BrushData::Invalid) {
        *color = brushFromData(data.color, pal);
        if (data.color.type != BrushData::DependsOnThePalette)
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
    }
}